

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O1

size_t Fossilize::compute_size_varint(uint32_t *words,size_t word_count)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar2 = 0;
  if (word_count != 0) {
    sVar3 = 0;
    do {
      uVar1 = words[sVar3];
      lVar4 = 1;
      if (((0x7f < uVar1) && (lVar4 = 2, 0x3fff < uVar1)) && (lVar4 = 3, 0x1fffff < uVar1)) {
        lVar4 = 5 - (ulong)(uVar1 < 0x10000000);
      }
      sVar2 = sVar2 + lVar4;
      sVar3 = sVar3 + 1;
    } while (word_count != sVar3);
  }
  return sVar2;
}

Assistant:

size_t compute_size_varint(const uint32_t *words, size_t word_count)
{
	size_t size = 0;
	for (size_t i = 0; i < word_count; i++)
	{
		auto w = words[i];
		if (w < (1u << 7))
			size += 1;
		else if (w < (1u << 14))
			size += 2;
		else if (w < (1u << 21))
			size += 3;
		else if (w < (1u << 28))
			size += 4;
		else
			size += 5;
	}
	return size;
}